

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBinary(TranslateToFuzzReader *this,Type type)

{
  byte bVar1;
  bool bVar2;
  BasicType BVar3;
  Index IVar4;
  Expression *this_00;
  ulong uVar5;
  Type local_1b0;
  Type local_1a8;
  BinaryArgs local_1a0;
  Type local_188;
  Type local_180;
  BinaryArgs local_178;
  Type local_160;
  Type local_158;
  BinaryArgs local_150;
  Type local_138;
  Type local_130;
  BinaryArgs local_128;
  Type local_110;
  Type local_108;
  BinaryArgs local_100;
  Type local_e8;
  Type local_e0;
  BinaryArgs local_d8;
  Type local_c0;
  Type local_b8;
  BinaryArgs local_b0;
  Type local_98;
  Type local_90;
  BinaryArgs local_88;
  TranslateToFuzzReader *local_70;
  TranslateToFuzzReader *local_68;
  Type local_60;
  Type local_58;
  BinaryArgs local_50;
  uintptr_t local_38;
  Binary *local_30;
  Binary *binary;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = wasm::Type::isTuple();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!type.isTuple()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x9ed,"Expression *wasm::TranslateToFuzzReader::makeBinary(Type)");
  }
  binary._4_4_ = 1;
  bVar2 = Type::operator==((Type *)&this_local,(BasicType *)((long)&binary + 4));
  if (bVar2) {
    local_38 = (uintptr_t)getSingleConcreteType(this);
    this_00 = makeBinary(this,(Type)local_38);
    local_30 = Expression::dynCast<wasm::Binary>(this_00);
    if (local_30 == (Binary *)0x0) {
      local_68 = this_local;
      type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
    }
    else {
      local_50.a = local_30->op;
      Type::Type(&local_58,unreachable);
      local_50.b = make(this,local_58);
      Type::Type(&local_60,unreachable);
      local_50.c = make(this,local_60);
      type_local.id = (uintptr_t)buildBinary(this,&local_50);
    }
  }
  else {
    uVar5 = wasm::Type::isRef();
    if ((uVar5 & 1) == 0) {
      BVar3 = Type::getBasic((Type *)&this_local);
      switch(BVar3) {
      case none:
      case unreachable:
        wasm::handle_unreachable
                  ("unexpected type",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xacd);
      case i32:
        IVar4 = upTo(this,4);
        switch(IVar4) {
        case 0:
          local_88.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this,AddInt32,SubInt32,MulInt32,DivSInt32,DivUInt32,RemSInt32,
                                  RemUInt32,AndInt32,OrInt32,XorInt32,ShlInt32,ShrUInt32,ShrSInt32,
                                  RotLInt32,RotRInt32,EqInt32,NeInt32,LtSInt32,LtUInt32,LeSInt32,
                                  LeUInt32,GtSInt32,GtUInt32,GeSInt32,GeUInt32);
          Type::Type(&local_90,i32);
          local_88.b = make(this,local_90);
          Type::Type(&local_98,i32);
          local_88.c = make(this,local_98);
          type_local.id = (uintptr_t)buildBinary(this,&local_88);
          break;
        case 1:
          local_b0.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this,EqInt64,NeInt64,LtSInt64,LtUInt64,LeSInt64,LeUInt64,GtSInt64,
                                  GtUInt64,GeSInt64,GeUInt64);
          Type::Type(&local_b8,i64);
          local_b0.b = make(this,local_b8);
          Type::Type(&local_c0,i64);
          local_b0.c = make(this,local_c0);
          type_local.id = (uintptr_t)buildBinary(this,&local_b0);
          break;
        case 2:
          local_d8.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this,EqFloat32,NeFloat32,LtFloat32,LeFloat32,GtFloat32,GeFloat32);
          Type::Type(&local_e0,f32);
          local_d8.b = make(this,local_e0);
          Type::Type(&local_e8,f32);
          local_d8.c = make(this,local_e8);
          type_local.id = (uintptr_t)buildBinary(this,&local_d8);
          break;
        case 3:
          local_100.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                  (this,EqFloat64,NeFloat64,LtFloat64,LeFloat64,GtFloat64,GeFloat64)
          ;
          Type::Type(&local_108,f64);
          local_100.b = make(this,local_108);
          Type::Type(&local_110,f64);
          local_100.c = make(this,local_110);
          type_local.id = (uintptr_t)buildBinary(this,&local_100);
          break;
        default:
          wasm::handle_unreachable
                    ("invalid value",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xa3a);
        }
        break;
      case i64:
        local_128.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                (this,AddInt64,SubInt64,MulInt64,DivSInt64,DivUInt64,RemSInt64,
                                 RemUInt64,AndInt64,OrInt64,XorInt64,ShlInt64,ShrUInt64,ShrSInt64,
                                 RotLInt64,RotRInt64);
        Type::Type(&local_130,i64);
        local_128.b = make(this,local_130);
        Type::Type(&local_138,i64);
        local_128.c = make(this,local_138);
        type_local.id = (uintptr_t)buildBinary(this,&local_128);
        break;
      case f32:
        local_150.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                (this,AddFloat32,SubFloat32,MulFloat32,DivFloat32,CopySignFloat32,
                                 MinFloat32,MaxFloat32);
        Type::Type(&local_158,f32);
        local_150.b = make(this,local_158);
        Type::Type(&local_160,f32);
        local_150.c = make(this,local_160);
        type_local.id = (uintptr_t)buildBinary(this,&local_150);
        break;
      case f64:
        local_178.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                (this,AddFloat64,SubFloat64,MulFloat64,DivFloat64,CopySignFloat64,
                                 MinFloat64,MaxFloat64);
        Type::Type(&local_180,f64);
        local_178.b = make(this,local_180);
        Type::Type(&local_188,f64);
        local_178.c = make(this,local_188);
        type_local.id = (uintptr_t)buildBinary(this,&local_178);
        break;
      case v128:
        bVar2 = FeatureSet::hasSIMD((FeatureSet *)(this->wasm + 0x108));
        if (!bVar2) {
          __assert_fail("wasm.features.hasSIMD()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0xa66,"Expression *wasm::TranslateToFuzzReader::makeBinary(Type)");
        }
        local_1a0.a = pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                (this,0x4c,0x4d,0x4e,0x4f,0x50,0x51,0x52,0x53,0x54,0x55,0x56,0x57,
                                 0x58,0x59,0x5a,0x5b,0x5c,0x5d,0x5e,0x5f,0x60,0x61,0x62,99,100,0x65,
                                 0x66,0x67,0x68,0x69,0x70,0x71,0x72,0x73,0x74,0x75,0x76,0x77,0x78,
                                 0x79,0x7a,0x7b,0x7c,0x7d,0x7e,0x7f,0x80,0x81,0x82,0x83,0x84,0x85,
                                 0x86,0x87,0x88,0x89,0x8b,0x8c,0x8d,0x8e,0x8f,0x90,0x91,0x92,0x93,
                                 0x94,0x95,0x9c);
        Type::Type(&local_1a8,v128);
        local_1a0.b = make(this,local_1a8);
        Type::Type(&local_1b0,v128);
        local_1a0.c = make(this,local_1b0);
        type_local.id = (uintptr_t)buildBinary(this,&local_1a0);
        break;
      default:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xacf);
      }
    }
    else {
      local_70 = this_local;
      type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeBinary(Type type) {
  assert(!type.isTuple());
  if (type == Type::unreachable) {
    if (auto* binary = makeBinary(getSingleConcreteType())->dynCast<Binary>()) {
      return buildBinary(
        {binary->op, make(Type::unreachable), make(Type::unreachable)});
    }
    // give up
    return makeTrivial(type);
  }
  // There are no binary ops for reference types.
  // TODO: Use struct.new
  if (type.isRef()) {
    return makeTrivial(type);
  }
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(4)) {
        case 0:
          return buildBinary({pick(AddInt32,
                                   SubInt32,
                                   MulInt32,
                                   DivSInt32,
                                   DivUInt32,
                                   RemSInt32,
                                   RemUInt32,
                                   AndInt32,
                                   OrInt32,
                                   XorInt32,
                                   ShlInt32,
                                   ShrUInt32,
                                   ShrSInt32,
                                   RotLInt32,
                                   RotRInt32,
                                   EqInt32,
                                   NeInt32,
                                   LtSInt32,
                                   LtUInt32,
                                   LeSInt32,
                                   LeUInt32,
                                   GtSInt32,
                                   GtUInt32,
                                   GeSInt32,
                                   GeUInt32),
                              make(Type::i32),
                              make(Type::i32)});
        case 1:
          return buildBinary({pick(EqInt64,
                                   NeInt64,
                                   LtSInt64,
                                   LtUInt64,
                                   LeSInt64,
                                   LeUInt64,
                                   GtSInt64,
                                   GtUInt64,
                                   GeSInt64,
                                   GeUInt64),
                              make(Type::i64),
                              make(Type::i64)});
        case 2:
          return buildBinary({pick(EqFloat32,
                                   NeFloat32,
                                   LtFloat32,
                                   LeFloat32,
                                   GtFloat32,
                                   GeFloat32),
                              make(Type::f32),
                              make(Type::f32)});
        case 3:
          return buildBinary({pick(EqFloat64,
                                   NeFloat64,
                                   LtFloat64,
                                   LeFloat64,
                                   GtFloat64,
                                   GeFloat64),
                              make(Type::f64),
                              make(Type::f64)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::i64: {
      return buildBinary({pick(AddInt64,
                               SubInt64,
                               MulInt64,
                               DivSInt64,
                               DivUInt64,
                               RemSInt64,
                               RemUInt64,
                               AndInt64,
                               OrInt64,
                               XorInt64,
                               ShlInt64,
                               ShrUInt64,
                               ShrSInt64,
                               RotLInt64,
                               RotRInt64),
                          make(Type::i64),
                          make(Type::i64)});
    }
    case Type::f32: {
      return buildBinary({pick(AddFloat32,
                               SubFloat32,
                               MulFloat32,
                               DivFloat32,
                               CopySignFloat32,
                               MinFloat32,
                               MaxFloat32),
                          make(Type::f32),
                          make(Type::f32)});
    }
    case Type::f64: {
      return buildBinary({pick(AddFloat64,
                               SubFloat64,
                               MulFloat64,
                               DivFloat64,
                               CopySignFloat64,
                               MinFloat64,
                               MaxFloat64),
                          make(Type::f64),
                          make(Type::f64)});
    }
    case Type::v128: {
      assert(wasm.features.hasSIMD());
      return buildBinary({pick(EqVecI8x16,
                               NeVecI8x16,
                               LtSVecI8x16,
                               LtUVecI8x16,
                               GtSVecI8x16,
                               GtUVecI8x16,
                               LeSVecI8x16,
                               LeUVecI8x16,
                               GeSVecI8x16,
                               GeUVecI8x16,
                               EqVecI16x8,
                               NeVecI16x8,
                               LtSVecI16x8,
                               LtUVecI16x8,
                               GtSVecI16x8,
                               GtUVecI16x8,
                               LeSVecI16x8,
                               LeUVecI16x8,
                               GeSVecI16x8,
                               GeUVecI16x8,
                               EqVecI32x4,
                               NeVecI32x4,
                               LtSVecI32x4,
                               LtUVecI32x4,
                               GtSVecI32x4,
                               GtUVecI32x4,
                               LeSVecI32x4,
                               LeUVecI32x4,
                               GeSVecI32x4,
                               GeUVecI32x4,
                               EqVecF32x4,
                               NeVecF32x4,
                               LtVecF32x4,
                               GtVecF32x4,
                               LeVecF32x4,
                               GeVecF32x4,
                               EqVecF64x2,
                               NeVecF64x2,
                               LtVecF64x2,
                               GtVecF64x2,
                               LeVecF64x2,
                               GeVecF64x2,
                               AndVec128,
                               OrVec128,
                               XorVec128,
                               AndNotVec128,
                               AddVecI8x16,
                               AddSatSVecI8x16,
                               AddSatUVecI8x16,
                               SubVecI8x16,
                               SubSatSVecI8x16,
                               SubSatUVecI8x16,
                               MinSVecI8x16,
                               MinUVecI8x16,
                               MaxSVecI8x16,
                               MaxUVecI8x16,
                               // TODO: avgr_u
                               // TODO: q15mulr_sat_s
                               // TODO: extmul
                               AddVecI16x8,
                               AddSatSVecI16x8,
                               AddSatUVecI16x8,
                               SubVecI16x8,
                               SubSatSVecI16x8,
                               SubSatUVecI16x8,
                               MulVecI16x8,
                               MinSVecI16x8,
                               MinUVecI16x8,
                               MaxSVecI16x8,
                               MaxUVecI16x8,
                               AddVecI32x4,
                               SubVecI32x4,
                               MulVecI32x4,
                               MinSVecI32x4,
                               MinUVecI32x4,
                               MaxSVecI32x4,
                               MaxUVecI32x4,
                               DotSVecI16x8ToVecI32x4,
                               AddVecI64x2,
                               SubVecI64x2,
                               AddVecF32x4,
                               SubVecF32x4,
                               MulVecF32x4,
                               DivVecF32x4,
                               MinVecF32x4,
                               MaxVecF32x4,
                               AddVecF64x2,
                               SubVecF64x2,
                               MulVecF64x2,
                               DivVecF64x2,
                               MinVecF64x2,
                               MaxVecF64x2,
                               NarrowSVecI16x8ToVecI8x16,
                               NarrowUVecI16x8ToVecI8x16,
                               NarrowSVecI32x4ToVecI16x8,
                               NarrowUVecI32x4ToVecI16x8,
                               SwizzleVecI8x16),
                          make(Type::v128),
                          make(Type::v128)});
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}